

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddTweak
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,TweakMethod tweak)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  string *os_00;
  bool bVar2;
  size_type sVar3;
  const_reference file;
  ulong uVar4;
  ostream *poVar5;
  TweakMethod in_stack_00000010;
  string local_2b8;
  int local_294;
  reference local_290;
  string *f;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  cmScriptGeneratorIndent local_268;
  cmScriptGeneratorIndent local_264;
  string local_260 [4];
  Indent indent2;
  string tws;
  allocator<char> local_229;
  string local_228;
  Indent local_204;
  undefined1 local_200 [8];
  ostringstream tw;
  string local_68;
  Indent local_44;
  TweakMethod tweak_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *config_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  tweak_local = in_stack_00000010;
  local_30 = files;
  files_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(files);
  os_00 = config_local;
  pvVar1 = files_local;
  if (sVar3 == 1) {
    local_44.Level = this_local._4_4_;
    file = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_30,0);
    GetDestDirPath(&local_68,this,file);
    AddTweak(this,(ostream *)os_00,local_44,(string *)pvVar1,&local_68,tweak_local);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    local_204.Level =
         (int)cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
    pvVar1 = files_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"${file}",&local_229);
    AddTweak(this,(ostream *)local_200,local_204,(string *)pvVar1,&local_228,tweak);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    std::__cxx11::ostringstream::str();
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_268 = cmScriptGeneratorIndent::Next
                            ((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
      local_264 = cmScriptGeneratorIndent::Next(&local_268,2);
      poVar5 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
      std::operator<<(poVar5,"foreach(file\n");
      pvVar1 = local_30;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(local_30);
      f = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(pvVar1);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&f);
        if (!bVar2) break;
        local_290 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        local_294 = local_264.Level;
        poVar5 = ::operator<<((ostream *)config_local,local_264);
        poVar5 = std::operator<<(poVar5,"\"");
        GetDestDirPath(&local_2b8,this,local_290);
        poVar5 = std::operator<<(poVar5,(string *)&local_2b8);
        std::operator<<(poVar5,"\"\n");
        std::__cxx11::string::~string((string *)&local_2b8);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      poVar5 = ::operator<<((ostream *)config_local,local_264);
      std::operator<<(poVar5,")\n");
      std::operator<<((ostream *)config_local,local_260);
      poVar5 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
      std::operator<<(poVar5,"endforeach()\n");
    }
    std::__cxx11::string::~string(local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddTweak(std::ostream& os, Indent indent,
                                        const std::string& config,
                                        std::vector<std::string> const& files,
                                        TweakMethod tweak)
{
  if (files.size() == 1) {
    // Tweak a single file.
    this->AddTweak(os, indent, config, this->GetDestDirPath(files[0]), tweak);
  } else {
    // Generate a foreach loop to tweak multiple files.
    std::ostringstream tw;
    this->AddTweak(tw, indent.Next(), config, "${file}", tweak);
    std::string tws = tw.str();
    if (!tws.empty()) {
      Indent indent2 = indent.Next().Next();
      os << indent << "foreach(file\n";
      for (std::string const& f : files) {
        os << indent2 << "\"" << this->GetDestDirPath(f) << "\"\n";
      }
      os << indent2 << ")\n";
      os << tws;
      os << indent << "endforeach()\n";
    }
  }
}